

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

void calculate_gf_length(AV1_COMP *cpi,int max_gop_length,int max_intervals)

{
  int *piVar1;
  FIRSTPASS_STATS *pFVar2;
  int f_w;
  int f_h;
  int iVar3;
  AV1_PRIMARY *pAVar4;
  FIRSTPASS_STATS *pFVar5;
  AV1_PRIMARY *pAVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  REGIONS *pRVar20;
  int iVar21;
  uint uVar22;
  FIRSTPASS_STATS *pFVar23;
  int *piVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  REGION_TYPES *pRVar30;
  uint uVar31;
  long lVar32;
  FIRSTPASS_STATS *pFVar33;
  uint uVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  int cut_pos [16];
  FIRSTPASS_STATS next_frame;
  double local_260;
  ulong local_258;
  FIRSTPASS_STATS *local_220;
  GF_GROUP_STATS local_1e8;
  uint local_158 [16];
  FIRSTPASS_STATS local_118;
  
  pAVar4 = cpi->ppi;
  pFVar5 = (cpi->twopass_frame).stats_in;
  iVar18 = (cpi->rc).frames_since_key;
  bVar36 = iVar18 == 0;
  f_w = (cpi->common).width;
  f_h = (cpi->common).height;
  memset(&local_118,0,0xe8);
  if (((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (pAVar4->lap_enabled == 0)) {
    lVar15 = 0;
    do {
      iVar18 = (cpi->rc).max_gf_interval;
      if (max_gop_length <= iVar18) {
        iVar18 = max_gop_length;
      }
      (pAVar4->p_rc).gf_intervals[lVar15] = iVar18;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0xf);
    (pAVar4->p_rc).cur_gf_index = 0;
    (cpi->rc).intervals_till_gf_calculate_due = 0xf;
  }
  else {
    iVar3 = (cpi->rc).min_gf_interval;
    iVar9 = (cpi->rc).max_gf_interval;
    if (iVar9 < max_gop_length) {
      max_gop_length = iVar9;
    }
    iVar9 = 6;
    if (6 < iVar3) {
      iVar9 = iVar3;
    }
    local_158[2] = 0;
    local_158[3] = 0;
    local_158[0xc] = 0;
    local_158[0xd] = 0;
    local_158[0xe] = 0;
    local_158[0xf] = 0;
    local_158[8] = 0;
    local_158[9] = 0;
    local_158[10] = 0;
    local_158[0xb] = 0;
    local_158[4] = 0;
    local_158[5] = 0;
    local_158[6] = 0;
    local_158[7] = 0;
    local_158[0] = 0xffffffff;
    local_158[1] = 0;
    local_1e8.gf_group_skip_pct = 0.0;
    local_1e8.gf_group_inactive_zone_rows = 0.0;
    local_1e8.gf_group_err = 0.0;
    local_1e8.gf_group_raw_error = 0.0;
    local_1e8.mv_ratio_accumulator = 0.0;
    local_1e8.decay_accumulator = 1.0;
    local_1e8.zero_motion_accumulator = 1.0;
    local_1e8.loop_decay_rate = 1.0;
    local_1e8.last_loop_decay_rate = 1.0;
    local_1e8.this_frame_mv_in_out = 0.0;
    local_1e8.mv_in_out_accumulator = 0.0;
    local_1e8.abs_mv_in_out_accumulator = 0.0;
    local_1e8.avg_sr_coded_error = 0.0;
    local_1e8.avg_pcnt_second_ref = 0.0;
    local_1e8.avg_new_mv_count = 0.0;
    local_1e8.avg_wavelet_energy = 0.0;
    local_1e8.avg_raw_err_stdev = 0.0;
    local_1e8.non_zero_stdev_count = 0;
    iVar13 = 2;
    if (pAVar4->lap_enabled == 0) {
      iVar13 = max_intervals + 1;
    }
    uVar22 = 1;
    if (1 < iVar13) {
      uVar11 = (uint)(iVar18 == 0);
      uVar25 = -(uint)((pAVar4->gf_state).arf_gf_boost_lst != 0);
      piVar1 = &(pAVar4->p_rc).regions[0].last;
      uVar22 = 1;
      do {
        if ((int)uVar11 < (cpi->rc).frames_to_key) {
          uVar34 = uVar11 - uVar25;
          if ((cpi->rc).static_scene_max_gf_interval <= (int)uVar34) goto LAB_001face2;
          pFVar23 = (cpi->twopass_frame).stats_in;
          pFVar33 = ((pAVar4->twopass).stats_buf_ctx)->stats_in_end;
          bVar37 = false;
          uVar31 = 0;
          bVar8 = 0;
          if (pFVar23 < pFVar33) {
            memcpy(&local_118,pFVar23,0xe8);
            pFVar2 = pFVar23 + 1;
            (cpi->twopass_frame).stats_in = pFVar2;
            if ((pFVar2 < pFVar33) &&
               (dVar40 = pFVar23[1].pcnt_second_ref,
               pFVar23[1].pcnt_inter <= dVar40 && dVar40 != pFVar23[1].pcnt_inter)) {
              uVar31 = (uint)(0.5 <= dVar40);
            }
            accumulate_next_frame_stats
                      (&local_118,uVar31,(cpi->rc).frames_since_key,uVar11,&local_1e8,f_w,f_h);
            pAVar6 = cpi->ppi;
            iVar18 = (cpi->common).width;
            iVar10 = (cpi->common).height;
            if ((uVar31 == 0) &&
               (iVar14 = detect_transition_to_still
                                   (&(pAVar6->twopass).firstpass_info,
                                    (int)((ulong)((long)pFVar2 -
                                                 (long)((pAVar6->twopass).stats_buf_ctx)->
                                                       stats_in_start) >> 3) * 0x4f72c235,
                                    (cpi->rc).min_gf_interval,uVar34,5,local_1e8.loop_decay_rate,
                                    local_1e8.last_loop_decay_rate), iVar14 != 0)) {
              bVar37 = false;
              bVar8 = 1;
            }
            else {
              if ((((((int)uVar34 < iVar3) ||
                    ((int)((cpi->rc).frames_to_key - uVar11) < (cpi->rc).min_gf_interval)) ||
                   ((uVar34 & 1) == 0)) || (uVar31 != 0)) ||
                 ((local_1e8.mv_ratio_accumulator <= (double)(iVar18 + iVar10) * 0.25 &&
                  (local_1e8.abs_mv_in_out_accumulator <= 4.4)))) {
                if (max_gop_length < (int)uVar34) {
                  if (cpi->ppi->lap_enabled == 0) {
                    bVar37 = 0x62 < (pAVar6->twopass).kf_zeromotion_pct &&
                             0.995 <= local_1e8.zero_motion_accumulator;
                  }
                  else {
                    bVar37 = 0.999 <= local_1e8.zero_motion_accumulator;
                  }
                  if (!bVar37) goto LAB_001face2;
                }
                bVar37 = true;
                goto LAB_001fabf9;
              }
LAB_001face2:
              bVar37 = false;
              bVar8 = 1;
            }
          }
        }
        else {
          bVar37 = false;
LAB_001fabf9:
          bVar8 = 0;
        }
        if (!bVar37) {
          uVar29 = uVar11 - 1;
          lVar15 = (long)(cpi->rc).frames_since_key - (long)(pAVar4->p_rc).regions_offset;
          uVar34 = (pAVar4->p_rc).num_regions;
          uVar35 = (ulong)uVar34;
          iVar18 = (int)lVar15;
          uVar31 = uVar29;
          if (((int)uVar25 < (int)uVar29) && ((int)(uVar29 - uVar25) <= max_gop_length)) {
            iVar14 = iVar18 + uVar25;
            iVar10 = -1;
            uVar19 = 0xffffffff;
            if (0 < (int)uVar34) {
              uVar19 = 0;
              piVar24 = piVar1;
              do {
                if ((((REGIONS *)(piVar24 + -1))->start <= iVar14) && (iVar14 <= *piVar24))
                goto LAB_001fad78;
                uVar19 = uVar19 + 1;
                piVar24 = piVar24 + 0xe;
              } while (uVar35 != uVar19);
              uVar19 = 0xffffffff;
            }
LAB_001fad78:
            iVar21 = iVar18 + uVar29;
            if (0 < (int)uVar34) {
              uVar26 = 0;
              piVar24 = piVar1;
              do {
                if ((((REGIONS *)(piVar24 + -1))->start <= iVar21) && (iVar21 <= *piVar24)) {
                  iVar10 = (int)uVar26;
                  break;
                }
                uVar26 = uVar26 + 1;
                piVar24 = piVar24 + 0xe;
              } while (uVar35 != uVar26);
            }
            iVar16 = (int)uVar19;
            if (iVar14 == 0) {
              iVar16 = 0;
            }
            iVar17 = -1;
            lVar28 = (long)iVar16;
            if (iVar16 < iVar10) {
              pRVar30 = &(pAVar4->p_rc).regions[lVar28 + 1].type;
              lVar32 = 0;
              do {
                if ((*pRVar30 == SCENECUT_REGION) && (iVar3 < (int)(pRVar30[-0xb] - iVar14))) {
                  iVar17 = (iVar16 - (int)lVar32) + 1;
                  break;
                }
                lVar32 = lVar32 + -1;
                pRVar30 = pRVar30 + 0xe;
              } while (lVar28 - iVar10 != lVar32);
            }
            iVar14 = (pAVar4->p_rc).regions[(long)(int)uVar34 + -1].last;
            if ((iVar17 == -1) || (iVar14 - (pAVar4->p_rc).regions[iVar17].last < 4)) {
              if (iVar10 == uVar34 - 1) {
                bVar37 = iVar21 == (pAVar4->p_rc).regions[iVar10].last;
              }
              else {
                bVar37 = false;
              }
              if ((!bVar37) ||
                 ((int)(((pAVar4->p_rc).regions[lVar28].type == SCENECUT_REGION) + 1) <
                  iVar10 - iVar16)) {
                iVar10 = (pAVar4->p_rc).regions[0].start - iVar18;
                iVar14 = iVar14 - iVar18;
                lVar15 = (long)(int)(uVar25 + 1);
                uVar19 = (ulong)(int)(uVar25 + iVar9);
                pFVar23 = pFVar5 + (lVar15 - (ulong)bVar36);
                dVar40 = 0.0;
                do {
                  if (((pAVar4->twopass).stats_buf_ctx)->stats_in_end <= pFVar23) break;
                  dVar40 = (dVar40 + 1.0) * pFVar23->cor_coeff;
                  lVar15 = lVar15 + 1;
                  pFVar23 = pFVar23 + 1;
                } while (lVar15 < (long)uVar19);
                bVar37 = false;
                local_258._0_4_ = 0xffffffff;
                if ((int)(uVar25 + iVar9) < (int)uVar11) {
                  local_220 = pFVar5 + ((uVar19 + 1) - (ulong)bVar36);
                  pFVar23 = pFVar5 + (uVar19 - bVar36);
                  local_260 = 0.0;
                  local_258 = 0xffffffff;
                  bVar7 = false;
                  do {
                    if (((pAVar4->twopass).stats_buf_ctx)->stats_in_end <=
                        pFVar5 + (uVar19 - bVar36)) break;
                    uVar26 = 0xffffffff;
                    iVar21 = (int)uVar19;
                    if (0 < (int)uVar34) {
                      uVar27 = 0;
                      piVar24 = piVar1;
                      do {
                        if ((((REGIONS *)(piVar24 + -1))->start <= iVar18 + iVar21) &&
                           (iVar18 + iVar21 <= *piVar24)) {
                          uVar26 = uVar27 & 0xffffffff;
                          break;
                        }
                        uVar27 = uVar27 + 1;
                        piVar24 = piVar24 + 0xe;
                      } while (uVar35 != uVar27);
                    }
                    dVar40 = (dVar40 + 1.0) * pFVar5[uVar19 - bVar36].cor_coeff;
                    if ((int)uVar26 < 0) {
                      cVar12 = '\x0f';
                    }
                    else if ((pAVar4->p_rc).regions[uVar26].type == BLENDING_REGION) {
                      bVar37 = !bVar7;
                      bVar7 = !bVar37;
                      if (bVar37) {
                        dVar40 = 0.0;
                      }
                      cVar12 = bVar37 * '\x02' + '\r';
                      bVar37 = true;
                    }
                    else {
                      if (bVar37) {
                        bVar7 = true;
                      }
                      dVar41 = dVar40 * 0.1;
                      lVar15 = 0;
                      if ((long)uVar19 < (long)iVar14) {
                        iVar16 = iVar21 + 3;
                        if (iVar14 <= iVar21 + 3) {
                          iVar16 = iVar14;
                        }
                        lVar15 = 0;
                        dVar42 = 1.0;
                        pFVar33 = local_220;
                        do {
                          if (((pAVar4->twopass).stats_buf_ctx)->stats_in_end <= pFVar33) break;
                          dVar42 = dVar42 * pFVar33->cor_coeff;
                          dVar38 = pFVar33->intra_error;
                          if (dVar38 <= 0.001) {
                            dVar38 = 0.001;
                          }
                          dVar39 = 1.0 - pFVar33->noise_var / dVar38;
                          dVar38 = 0.5;
                          if (0.5 <= dVar39) {
                            dVar38 = dVar39;
                          }
                          if (dVar38 < 0.0) {
                            dVar38 = sqrt(dVar38);
                          }
                          else {
                            dVar38 = SQRT(dVar38);
                          }
                          dVar41 = dVar41 + dVar38 * dVar42;
                          pFVar33 = pFVar33 + 1;
                          lVar28 = uVar19 + lVar15;
                          lVar15 = lVar15 + 1;
                        } while (lVar28 + 1 < (long)iVar16);
                      }
                      iVar21 = iVar21 + (int)lVar15 + -6;
                      if (iVar21 <= iVar10) {
                        iVar21 = iVar10;
                      }
                      if ((long)iVar21 < (long)uVar19) {
                        dVar42 = 1.0;
                        uVar26 = uVar19;
                        pFVar33 = pFVar23;
                        do {
                          if (pFVar33 < ((pAVar4->twopass).stats_buf_ctx)->stats_in_start) break;
                          dVar42 = dVar42 * pFVar33->cor_coeff;
                          dVar38 = pFVar33->intra_error;
                          if (dVar38 <= 0.001) {
                            dVar38 = 0.001;
                          }
                          dVar39 = 1.0 - pFVar33->noise_var / dVar38;
                          dVar38 = 0.5;
                          if (0.5 <= dVar39) {
                            dVar38 = dVar39;
                          }
                          if (dVar38 < 0.0) {
                            dVar38 = sqrt(dVar38);
                          }
                          else {
                            dVar38 = SQRT(dVar38);
                          }
                          dVar41 = dVar41 + dVar38 * dVar42;
                          uVar26 = uVar26 - 1;
                          pFVar33 = pFVar33 + -1;
                        } while ((long)iVar21 < (long)uVar26);
                      }
                      if (local_260 < dVar41) {
                        local_258 = uVar19;
                      }
                      local_258 = local_258 & 0xffffffff;
                      if (dVar41 <= local_260) {
                        dVar41 = local_260;
                      }
                      bVar37 = false;
                      cVar12 = '\0';
                      local_260 = dVar41;
                    }
                    if ((cVar12 != '\x0f') && (cVar12 != '\0')) break;
                    uVar19 = uVar19 + 1;
                    local_220 = local_220 + 1;
                    pFVar23 = pFVar23 + 1;
                  } while ((long)uVar19 < (long)(int)uVar11);
                  bVar37 = 0.1 < local_260;
                }
                iVar10 = (uint)local_258 + iVar18;
                if ((int)uVar34 < 1) {
                  uVar11 = 0xffffffff;
                }
                else {
                  uVar19 = 0;
                  uVar11 = 0xffffffff;
                  piVar24 = piVar1;
                  do {
                    if ((((REGIONS *)(piVar24 + -1))->start <= iVar10) && (iVar10 <= *piVar24)) {
                      uVar11 = (uint)uVar19;
                      break;
                    }
                    uVar19 = uVar19 + 1;
                    piVar24 = piVar24 + 0xe;
                  } while (uVar35 != uVar19);
                }
                if (((0 < (int)uVar11 && (int)uVar11 < (int)(uVar34 - 1)) &&
                    ((pAVar4->p_rc).regions[(ulong)uVar11 - 1].type == BLENDING_REGION)) &&
                   (pRVar20 = (pAVar4->p_rc).regions + uVar11, pRVar20[1].type == BLENDING_REGION))
                {
                  if ((iVar10 == pRVar20->start) && (iVar10 < pRVar20->last)) {
                    local_258._0_4_ = (uint)local_258 + 1;
                  }
                  else if (iVar10 == pRVar20->last) {
                    local_258._0_4_ = (uint)local_258 - (pRVar20->start < iVar10);
                  }
                }
                if ((int)(uVar29 - (uint)local_258) < 2) {
                  local_258._0_4_ = uVar29;
                }
                if (bVar37) {
                  uVar31 = (uint)local_258;
                }
                if ((int)(uint)local_258 < 1) {
                  uVar31 = uVar29;
                }
              }
            }
            else {
              uVar31 = ((pAVar4->p_rc).regions[iVar17].last - iVar18) -
                       (uint)((1.0 - pFVar5[((pAVar4->p_rc).regions[iVar17].start - lVar15) -
                                            (ulong)bVar36].noise_var /
                                     (pAVar4->p_rc).regions[iVar17].avg_intra_err) *
                              (pAVar4->p_rc).regions[iVar17].avg_cor_coeff <= 0.6);
            }
          }
          uVar11 = uVar31;
          local_158[(int)uVar22] = uVar11;
          (cpi->twopass_frame).stats_in = pFVar5 + (int)uVar11;
          uVar19 = 0xffffffff;
          if (0 < (int)uVar34) {
            iVar18 = uVar11 + iVar18 + 1;
            uVar26 = 0;
            piVar24 = piVar1;
            do {
              if ((((REGIONS *)(piVar24 + -1))->start <= iVar18) && (iVar18 <= *piVar24)) {
                uVar19 = uVar26 & 0xffffffff;
                break;
              }
              uVar26 = uVar26 + 1;
              piVar24 = piVar24 + 0xe;
            } while (uVar35 != uVar26);
          }
          uVar25 = uVar11;
          if ((-1 < (int)uVar19) &&
             (uVar25 = uVar11 + 1, (pAVar4->p_rc).regions[uVar19].type != SCENECUT_REGION)) {
            uVar25 = uVar11;
          }
          uVar22 = uVar22 + 1;
          if ((bool)(~bVar8 & uVar11 == uVar29)) break;
          local_1e8.gf_group_skip_pct = 0.0;
          local_1e8.gf_group_inactive_zone_rows = 0.0;
          local_1e8.gf_group_err = 0.0;
          local_1e8.gf_group_raw_error = 0.0;
          local_1e8.mv_ratio_accumulator = 0.0;
          local_1e8.decay_accumulator = 1.0;
          local_1e8.zero_motion_accumulator = 1.0;
          local_1e8.loop_decay_rate = 1.0;
          local_1e8.last_loop_decay_rate = 1.0;
          local_1e8.avg_wavelet_energy = 0.0;
          local_1e8.avg_raw_err_stdev = 0.0;
          local_1e8.avg_pcnt_second_ref = 0.0;
          local_1e8.avg_new_mv_count = 0.0;
          local_1e8.abs_mv_in_out_accumulator = 0.0;
          local_1e8.avg_sr_coded_error = 0.0;
          local_1e8.this_frame_mv_in_out = 0.0;
          local_1e8.mv_in_out_accumulator = 0.0;
          local_1e8.non_zero_stdev_count = 0;
        }
        uVar11 = uVar11 + 1;
      } while ((int)uVar22 < iVar13);
    }
    (cpi->rc).intervals_till_gf_calculate_due = uVar22 - 1;
    if (1 < (int)uVar22) {
      lVar15 = 0;
      do {
        (pAVar4->p_rc).gf_intervals[lVar15] = local_158[lVar15 + 1] - local_158[lVar15];
        lVar15 = lVar15 + 1;
      } while ((ulong)uVar22 - 1 != lVar15);
    }
    (pAVar4->p_rc).cur_gf_index = 0;
    (cpi->twopass_frame).stats_in = pFVar5;
  }
  return;
}

Assistant:

static void calculate_gf_length(AV1_COMP *cpi, int max_gop_length,
                                int max_intervals) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FIRSTPASS_STATS next_frame;
  const FIRSTPASS_STATS *const start_pos = cpi->twopass_frame.stats_in;
  const FIRSTPASS_STATS *const stats = start_pos - (rc->frames_since_key == 0);

  const int f_w = cpi->common.width;
  const int f_h = cpi->common.height;
  int i;

  int flash_detected;

  av1_zero(next_frame);

  if (has_no_stats_stage(cpi)) {
    for (i = 0; i < MAX_NUM_GF_INTERVALS; i++) {
      p_rc->gf_intervals[i] = AOMMIN(rc->max_gf_interval, max_gop_length);
    }
    p_rc->cur_gf_index = 0;
    rc->intervals_till_gf_calculate_due = MAX_NUM_GF_INTERVALS;
    return;
  }

  // TODO(urvang): Try logic to vary min and max interval based on q.
  const int active_min_gf_interval = rc->min_gf_interval;
  const int active_max_gf_interval =
      AOMMIN(rc->max_gf_interval, max_gop_length);
  const int min_shrink_int = AOMMAX(MIN_SHRINK_LEN, active_min_gf_interval);

  i = (rc->frames_since_key == 0);
  max_intervals = cpi->ppi->lap_enabled ? 1 : max_intervals;
  int count_cuts = 1;
  // If cpi->gf_state.arf_gf_boost_lst is 0, we are starting with a KF or GF.
  int cur_start = -1 + !cpi->ppi->gf_state.arf_gf_boost_lst, cur_last;
  int cut_pos[MAX_NUM_GF_INTERVALS + 1] = { -1 };
  int cut_here;
  GF_GROUP_STATS gf_stats;
  init_gf_stats(&gf_stats);
  while (count_cuts < max_intervals + 1) {
    // reaches next key frame, break here
    if (i >= rc->frames_to_key) {
      cut_here = 2;
    } else if (i - cur_start >= rc->static_scene_max_gf_interval) {
      // reached maximum len, but nothing special yet (almost static)
      // let's look at the next interval
      cut_here = 1;
    } else if (EOF == input_stats(twopass, &cpi->twopass_frame, &next_frame)) {
      // reaches last frame, break
      cut_here = 2;
    } else {
      // Test for the case where there is a brief flash but the prediction
      // quality back to an earlier frame is then restored.
      flash_detected = detect_flash(twopass, &cpi->twopass_frame, 0);
      // TODO(bohanli): remove redundant accumulations here, or unify
      // this and the ones in define_gf_group
      accumulate_next_frame_stats(&next_frame, flash_detected,
                                  rc->frames_since_key, i, &gf_stats, f_w, f_h);

      cut_here = detect_gf_cut(cpi, i, cur_start, flash_detected,
                               active_max_gf_interval, active_min_gf_interval,
                               &gf_stats);
    }
    if (cut_here) {
      cur_last = i - 1;  // the current last frame in the gf group
      int ori_last = cur_last;
      // The region frame idx does not start from the same frame as cur_start
      // and cur_last. Need to offset them.
      int offset = rc->frames_since_key - p_rc->regions_offset;
      REGIONS *regions = p_rc->regions;
      int num_regions = p_rc->num_regions;

      int scenecut_idx = -1;
      // only try shrinking if interval smaller than active_max_gf_interval
      if (cur_last - cur_start <= active_max_gf_interval &&
          cur_last > cur_start) {
        // find the region indices of where the first and last frame belong.
        int k_start =
            find_regions_index(regions, num_regions, cur_start + offset);
        int k_last =
            find_regions_index(regions, num_regions, cur_last + offset);
        if (cur_start + offset == 0) k_start = 0;

        // See if we have a scenecut in between
        for (int r = k_start + 1; r <= k_last; r++) {
          if (regions[r].type == SCENECUT_REGION &&
              regions[r].last - offset - cur_start > active_min_gf_interval) {
            scenecut_idx = r;
            break;
          }
        }

        // if the found scenecut is very close to the end, ignore it.
        if (regions[num_regions - 1].last - regions[scenecut_idx].last < 4) {
          scenecut_idx = -1;
        }

        if (scenecut_idx != -1) {
          // If we have a scenecut, then stop at it.
          // TODO(bohanli): add logic here to stop before the scenecut and for
          // the next gop start from the scenecut with GF
          int is_minor_sc =
              (regions[scenecut_idx].avg_cor_coeff *
                   (1 - stats[regions[scenecut_idx].start - offset].noise_var /
                            regions[scenecut_idx].avg_intra_err) >
               0.6);
          cur_last = regions[scenecut_idx].last - offset - !is_minor_sc;
        } else {
          int is_last_analysed = (k_last == num_regions - 1) &&
                                 (cur_last + offset == regions[k_last].last);
          int not_enough_regions =
              k_last - k_start <=
              1 + (regions[k_start].type == SCENECUT_REGION);
          // if we are very close to the end, then do not shrink since it may
          // introduce intervals that are too short
          if (!(is_last_analysed && not_enough_regions)) {
            const double arf_length_factor = 0.1;
            double best_score = 0;
            int best_j = -1;
            const int first_frame = regions[0].start - offset;
            const int last_frame = regions[num_regions - 1].last - offset;
            // score of how much the arf helps the whole GOP
            double base_score = 0.0;
            // Accumulate base_score in
            for (int j = cur_start + 1; j < cur_start + min_shrink_int; j++) {
              if (stats + j >= twopass->stats_buf_ctx->stats_in_end) break;
              base_score = (base_score + 1.0) * stats[j].cor_coeff;
            }
            int met_blending = 0;   // Whether we have met blending areas before
            int last_blending = 0;  // Whether the previous frame if blending
            for (int j = cur_start + min_shrink_int; j <= cur_last; j++) {
              if (stats + j >= twopass->stats_buf_ctx->stats_in_end) break;
              base_score = (base_score + 1.0) * stats[j].cor_coeff;
              int this_reg =
                  find_regions_index(regions, num_regions, j + offset);
              if (this_reg < 0) continue;
              // A GOP should include at most 1 blending region.
              if (regions[this_reg].type == BLENDING_REGION) {
                last_blending = 1;
                if (met_blending) {
                  break;
                } else {
                  base_score = 0;
                  continue;
                }
              } else {
                if (last_blending) met_blending = 1;
                last_blending = 0;
              }

              // Add the factor of how good the neighborhood is for this
              // candidate arf.
              double this_score = arf_length_factor * base_score;
              double temp_accu_coeff = 1.0;
              // following frames
              int count_f = 0;
              for (int n = j + 1; n <= j + 3 && n <= last_frame; n++) {
                if (stats + n >= twopass->stats_buf_ctx->stats_in_end) break;
                temp_accu_coeff *= stats[n].cor_coeff;
                this_score +=
                    temp_accu_coeff *
                    sqrt(AOMMAX(0.5,
                                1 - stats[n].noise_var /
                                        AOMMAX(stats[n].intra_error, 0.001)));
                count_f++;
              }
              // preceding frames
              temp_accu_coeff = 1.0;
              for (int n = j; n > j - 3 * 2 + count_f && n > first_frame; n--) {
                if (stats + n < twopass->stats_buf_ctx->stats_in_start) break;
                temp_accu_coeff *= stats[n].cor_coeff;
                this_score +=
                    temp_accu_coeff *
                    sqrt(AOMMAX(0.5,
                                1 - stats[n].noise_var /
                                        AOMMAX(stats[n].intra_error, 0.001)));
              }

              if (this_score > best_score) {
                best_score = this_score;
                best_j = j;
              }
            }

            // For blending areas, move one more frame in case we missed the
            // first blending frame.
            int best_reg =
                find_regions_index(regions, num_regions, best_j + offset);
            if (best_reg < num_regions - 1 && best_reg > 0) {
              if (regions[best_reg - 1].type == BLENDING_REGION &&
                  regions[best_reg + 1].type == BLENDING_REGION) {
                if (best_j + offset == regions[best_reg].start &&
                    best_j + offset < regions[best_reg].last) {
                  best_j += 1;
                } else if (best_j + offset == regions[best_reg].last &&
                           best_j + offset > regions[best_reg].start) {
                  best_j -= 1;
                }
              }
            }

            if (cur_last - best_j < 2) best_j = cur_last;
            if (best_j > 0 && best_score > 0.1) cur_last = best_j;
            // if cannot find anything, just cut at the original place.
          }
        }
      }
      cut_pos[count_cuts] = cur_last;
      count_cuts++;

      // reset pointers to the shrunken location
      cpi->twopass_frame.stats_in = start_pos + cur_last;
      cur_start = cur_last;
      int cur_region_idx =
          find_regions_index(regions, num_regions, cur_start + 1 + offset);
      if (cur_region_idx >= 0)
        if (regions[cur_region_idx].type == SCENECUT_REGION) cur_start++;

      i = cur_last;

      if (cut_here > 1 && cur_last == ori_last) break;

      // reset accumulators
      init_gf_stats(&gf_stats);
    }
    ++i;
  }

  // save intervals
  rc->intervals_till_gf_calculate_due = count_cuts - 1;
  for (int n = 1; n < count_cuts; n++) {
    p_rc->gf_intervals[n - 1] = cut_pos[n] - cut_pos[n - 1];
  }
  p_rc->cur_gf_index = 0;
  cpi->twopass_frame.stats_in = start_pos;
}